

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O0

wchar_t do_shape(bidi_char *line,bidi_char *to,wchar_t count)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  unsigned_short uVar4;
  bidi_char *pbVar5;
  bidi_char *pbVar6;
  int local_2c;
  wchar_t wStack_20;
  _Bool ligFlag;
  wchar_t tempShape;
  wchar_t i;
  wchar_t count_local;
  bidi_char *to_local;
  bidi_char *line_local;
  
  bVar2 = false;
  wStack_20 = L'\0';
  do {
    if (count <= wStack_20) {
      return L'\x01';
    }
    pbVar5 = to + wStack_20;
    pbVar6 = line + wStack_20;
    uVar3 = pbVar6->wc;
    pbVar5->origwc = pbVar6->origwc;
    pbVar5->wc = uVar3;
    uVar4 = pbVar6->nchars;
    pbVar5->index = pbVar6->index;
    pbVar5->nchars = uVar4;
    if ((line[wStack_20].wc < 0x621) || (0x6d2 < line[wStack_20].wc)) {
      local_2c = 3;
    }
    else {
      local_2c = (int)shapetypes[line[wStack_20].wc - 0x621].type;
    }
    switch(local_2c) {
    case 1:
      if (wStack_20 + L'\x01' < count) {
        if ((line[wStack_20 + L'\x01'].wc < 0x621) || (0x6d2 < line[wStack_20 + L'\x01'].wc)) {
          cVar1 = '\x03';
        }
        else {
          cVar1 = shapetypes[line[wStack_20 + L'\x01'].wc - 0x621].type;
        }
      }
      else {
        cVar1 = '\x03';
      }
      if (((cVar1 == '\0') || (cVar1 == '\x02')) || (cVar1 == '\x04')) {
        to[wStack_20].wc = shapetypes[line[wStack_20].wc - 0x621].form_b + L'\x01';
      }
      else {
        to[wStack_20].wc = shapetypes[line[wStack_20].wc - 0x621].form_b;
      }
      break;
    case 2:
      if (wStack_20 + L'\x01' < count) {
        if ((line[wStack_20 + L'\x01'].wc < 0x621) || (0x6d2 < line[wStack_20 + L'\x01'].wc)) {
          cVar1 = '\x03';
        }
        else {
          cVar1 = shapetypes[line[wStack_20 + L'\x01'].wc - 0x621].type;
        }
      }
      else {
        cVar1 = '\x03';
      }
      if (line[wStack_20].wc == 0x644) {
        if (L'\0' < wStack_20) {
          switch(line[wStack_20 + L'\xffffffff'].wc) {
          case 0x622:
            bVar2 = true;
            if (((cVar1 == '\0') || (cVar1 == '\x02')) || (cVar1 == '\x04')) {
              to[wStack_20].wc = 0xfef6;
            }
            else {
              to[wStack_20].wc = 0xfef5;
            }
            break;
          case 0x623:
            bVar2 = true;
            if (((cVar1 == '\0') || (cVar1 == '\x02')) || (cVar1 == '\x04')) {
              to[wStack_20].wc = 0xfef8;
            }
            else {
              to[wStack_20].wc = 0xfef7;
            }
            break;
          case 0x625:
            bVar2 = true;
            if (((cVar1 == '\0') || (cVar1 == '\x02')) || (cVar1 == '\x04')) {
              to[wStack_20].wc = 0xfefa;
            }
            else {
              to[wStack_20].wc = 0xfef9;
            }
            break;
          case 0x627:
            bVar2 = true;
            if (((cVar1 == '\0') || (cVar1 == '\x02')) || (cVar1 == '\x04')) {
              to[wStack_20].wc = 0xfefc;
            }
            else {
              to[wStack_20].wc = 0xfefb;
            }
          }
        }
        if (bVar2) {
          to[wStack_20 + L'\xffffffff'].wc = 0x20;
          bVar2 = false;
          break;
        }
      }
      if (((cVar1 == '\0') || (cVar1 == '\x02')) || (cVar1 == '\x04')) {
        if (wStack_20 < L'\x01') {
          cVar1 = '\x03';
        }
        else if ((line[wStack_20 + L'\xffffffff'].wc < 0x621) ||
                (0x6d2 < line[wStack_20 + L'\xffffffff'].wc)) {
          cVar1 = '\x03';
        }
        else {
          cVar1 = shapetypes[line[wStack_20 + L'\xffffffff'].wc - 0x621].type;
        }
        if (((cVar1 == '\x01') || (cVar1 == '\x02')) || (cVar1 == '\x04')) {
          to[wStack_20].wc = shapetypes[line[wStack_20].wc - 0x621].form_b + L'\x03';
        }
        else {
          to[wStack_20].wc = shapetypes[line[wStack_20].wc - 0x621].form_b + L'\x01';
        }
      }
      else {
        if (wStack_20 < L'\x01') {
          cVar1 = '\x03';
        }
        else if ((line[wStack_20 + L'\xffffffff'].wc < 0x621) ||
                (0x6d2 < line[wStack_20 + L'\xffffffff'].wc)) {
          cVar1 = '\x03';
        }
        else {
          cVar1 = shapetypes[line[wStack_20 + L'\xffffffff'].wc - 0x621].type;
        }
        if (((cVar1 == '\x01') || (cVar1 == '\x02')) || (cVar1 == '\x04')) {
          to[wStack_20].wc = shapetypes[line[wStack_20].wc - 0x621].form_b + L'\x02';
        }
        else {
          to[wStack_20].wc = shapetypes[line[wStack_20].wc - 0x621].form_b;
        }
      }
      break;
    case 3:
      break;
    case 4:
    }
    wStack_20 = wStack_20 + L'\x01';
  } while( true );
}

Assistant:

int do_shape(bidi_char *line, bidi_char *to, int count)
{
    int i, tempShape;
    bool ligFlag = false;

    for (i=0; i<count; i++) {
        to[i] = line[i];
        tempShape = STYPE(line[i].wc);
        switch (tempShape) {
          case SC:
            break;

          case SU:
            break;

          case SR:
            tempShape = (i+1 < count ? STYPE(line[i+1].wc) : SU);
            if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                to[i].wc = SFINAL((SISOLATED(line[i].wc)));
            else
                to[i].wc = SISOLATED(line[i].wc);
            break;


          case SD:
            /* Make Ligatures */
            tempShape = (i+1 < count ? STYPE(line[i+1].wc) : SU);
            if (line[i].wc == 0x644) {
                if (i > 0) switch (line[i-1].wc) {
                  case 0x622:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEF6;
                    else
                        to[i].wc = 0xFEF5;
                    break;
                  case 0x623:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEF8;
                    else
                        to[i].wc = 0xFEF7;
                    break;
                  case 0x625:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEFA;
                    else
                        to[i].wc = 0xFEF9;
                    break;
                  case 0x627:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEFC;
                    else
                        to[i].wc = 0xFEFB;
                    break;
                }
                if (ligFlag) {
                    to[i-1].wc = 0x20;
                    ligFlag = false;
                    break;
                }
            }

            if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC)) {
                tempShape = (i > 0 ? STYPE(line[i-1].wc) : SU);
                if ((tempShape == SR) || (tempShape == SD) || (tempShape == SC))
                    to[i].wc = SMEDIAL((SISOLATED(line[i].wc)));
                else
                    to[i].wc = SFINAL((SISOLATED(line[i].wc)));
                break;
            }

            tempShape = (i > 0 ? STYPE(line[i-1].wc) : SU);
            if ((tempShape == SR) || (tempShape == SD) || (tempShape == SC))
                to[i].wc = SINITIAL((SISOLATED(line[i].wc)));
            else
                to[i].wc = SISOLATED(line[i].wc);
            break;


        }
    }
    return 1;
}